

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetupColumn
               (char *label,ImGuiTableColumnFlags flags,float init_width_or_weight,ImGuiID user_id)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ImGuiTableColumn *str_end;
  ImGuiID in_EDX;
  char *in_RDI;
  float in_XMM0_Da;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffb0;
  ImGuiTableColumn *in_stack_ffffffffffffffb8;
  ImGuiTable *in_stack_ffffffffffffffc0;
  float local_34;
  ImGuiTable *str;
  ImGuiContext *this;
  
  str = GImGui->CurrentTable;
  if ((int)str->DeclColumnsCount < str->ColumnsCount) {
    this = GImGui;
    str_end = ImSpan<ImGuiTableColumn>::operator[](&str->Columns,(int)str->DeclColumnsCount);
    str->DeclColumnsCount = str->DeclColumnsCount + '\x01';
    TableSetupColumnFlags
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (ImGuiTableColumnFlags)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    str_end->UserID = in_EDX;
    uVar1 = str_end->Flags;
    str_end->InitStretchWeightOrWidth = in_XMM0_Da;
    if ((str->IsInitializing & 1U) != 0) {
      if ((str_end->WidthRequest < 0.0) && (str_end->StretchWeight < 0.0)) {
        if (((uVar1 & 0x10) != 0) && (0.0 < in_XMM0_Da)) {
          str_end->WidthRequest = in_XMM0_Da;
        }
        if ((uVar1 & 8) != 0) {
          local_34 = in_XMM0_Da;
          if (in_XMM0_Da <= 0.0) {
            local_34 = -1.0;
          }
          str_end->StretchWeight = local_34;
        }
        if (0.0 < in_XMM0_Da) {
          str_end->AutoFitQueue = '\0';
        }
      }
      if (((uVar1 & 2) != 0) && ((str->SettingsLoadedFlags & 4U) == 0)) {
        str_end->IsUserEnabledNextFrame = false;
        str_end->IsUserEnabled = false;
      }
      if (((uVar1 & 4) != 0) && ((str->SettingsLoadedFlags & 8U) == 0)) {
        str_end->SortOrder = '\0';
        bVar2 = 1;
        if ((str_end->Flags & 0x8000U) != 0) {
          bVar2 = 2;
        }
        str_end->field_0x65 = str_end->field_0x65 & 0xfc | bVar2;
      }
    }
    str_end->NameOffset = -1;
    if ((in_RDI != (char *)0x0) && (*in_RDI != '\0')) {
      iVar3 = ImGuiTextBuffer::size(&str->ColumnsNames);
      str_end->NameOffset = (ImS16)iVar3;
      strlen(in_RDI);
      ImGuiTextBuffer::append((ImGuiTextBuffer *)this,(char *)str,(char *)str_end);
    }
  }
  return;
}

Assistant:

void ImGui::TableSetupColumn(const char* label, ImGuiTableColumnFlags flags, float init_width_or_weight, ImGuiID user_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call call TableSetupColumn() before first row!");
    IM_ASSERT((flags & ImGuiTableColumnFlags_StatusMask_) == 0 && "Illegal to pass StatusMask values to TableSetupColumn()");
    if (table->DeclColumnsCount >= table->ColumnsCount)
    {
        IM_ASSERT_USER_ERROR(table->DeclColumnsCount < table->ColumnsCount, "Called TableSetupColumn() too many times!");
        return;
    }

    ImGuiTableColumn* column = &table->Columns[table->DeclColumnsCount];
    table->DeclColumnsCount++;

    // Assert when passing a width or weight if policy is entirely left to default, to avoid storing width into weight and vice-versa.
    // Give a grace to users of ImGuiTableFlags_ScrollX.
    if (table->IsDefaultSizingPolicy && (flags & ImGuiTableColumnFlags_WidthMask_) == 0 && (flags & ImGuiTableFlags_ScrollX) == 0)
        IM_ASSERT(init_width_or_weight <= 0.0f && "Can only specify width/weight if sizing policy is set explicitly in either Table or Column.");

    // When passing a width automatically enforce WidthFixed policy
    // (whereas TableSetupColumnFlags would default to WidthAuto if table is not Resizable)
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0 && init_width_or_weight > 0.0f)
        if ((table->Flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedFit || (table->Flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;

    TableSetupColumnFlags(table, column, flags);
    column->UserID = user_id;
    flags = column->Flags;

    // Initialize defaults
    column->InitStretchWeightOrWidth = init_width_or_weight;
    if (table->IsInitializing)
    {
        // Init width or weight
        if (column->WidthRequest < 0.0f && column->StretchWeight < 0.0f)
        {
            if ((flags & ImGuiTableColumnFlags_WidthFixed) && init_width_or_weight > 0.0f)
                column->WidthRequest = init_width_or_weight;
            if (flags & ImGuiTableColumnFlags_WidthStretch)
                column->StretchWeight = (init_width_or_weight > 0.0f) ? init_width_or_weight : -1.0f;

            // Disable auto-fit if an explicit width/weight has been specified
            if (init_width_or_weight > 0.0f)
                column->AutoFitQueue = 0x00;
        }

        // Init default visibility/sort state
        if ((flags & ImGuiTableColumnFlags_DefaultHide) && (table->SettingsLoadedFlags & ImGuiTableFlags_Hideable) == 0)
            column->IsUserEnabled = column->IsUserEnabledNextFrame = false;
        if (flags & ImGuiTableColumnFlags_DefaultSort && (table->SettingsLoadedFlags & ImGuiTableFlags_Sortable) == 0)
        {
            column->SortOrder = 0; // Multiple columns using _DefaultSort will be reassigned unique SortOrder values when building the sort specs.
            column->SortDirection = (column->Flags & ImGuiTableColumnFlags_PreferSortDescending) ? (ImS8)ImGuiSortDirection_Descending : (ImU8)(ImGuiSortDirection_Ascending);
        }
    }

    // Store name (append with zero-terminator in contiguous buffer)
    column->NameOffset = -1;
    if (label != NULL && label[0] != 0)
    {
        column->NameOffset = (ImS16)table->ColumnsNames.size();
        table->ColumnsNames.append(label, label + strlen(label) + 1);
    }
}